

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_genkey.c
# Opt level: O0

int main(void)

{
  size_t len;
  char *pers;
  FILE *fpriv;
  FILE *fpub;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_rsa_context rsa;
  int ret;
  
  rsa.hash_id = 0;
  fpriv = (FILE *)0x0;
  pers = (char *)0x0;
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&fpub);
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  len = strlen("rsa_genkey");
  rsa.padding = mbedtls_ctr_drbg_seed
                          ((mbedtls_ctr_drbg_context *)&fpub,mbedtls_entropy_func,
                           &ctr_drbg.p_entropy,(uchar *)"rsa_genkey",len);
  if (rsa.padding == 0) {
    printf(" ok\n  . Generating the RSA key [ %d-bit ]...",0x800);
    fflush(_stdout);
    mbedtls_rsa_init((mbedtls_rsa_context *)&entropy.source[0x13].strong,0,0);
    rsa.padding = mbedtls_rsa_gen_key((mbedtls_rsa_context *)&entropy.source[0x13].strong,
                                      mbedtls_ctr_drbg_random,&fpub,0x800,0x10001);
    if (rsa.padding == 0) {
      printf(" ok\n  . Exporting the public  key in rsa_pub.txt....");
      fflush(_stdout);
      fpriv = (FILE *)fopen("rsa_pub.txt","wb+");
      if ((FILE *)fpriv == (FILE *)0x0) {
        printf(" failed\n  ! could not open rsa_pub.txt for writing\n\n");
        rsa.padding = 1;
      }
      else {
        rsa.padding = mbedtls_mpi_write_file("N = ",(mbedtls_mpi *)&rsa.len,0x10,fpriv);
        if (rsa.padding == 0) {
          rsa.padding = mbedtls_mpi_write_file("E = ",(mbedtls_mpi *)&rsa.N.p,0x10,fpriv);
          if (rsa.padding == 0) {
            printf(" ok\n  . Exporting the private key in rsa_priv.txt...");
            fflush(_stdout);
            pers = (char *)fopen("rsa_priv.txt","wb+");
            if ((FILE *)pers == (FILE *)0x0) {
              printf(" failed\n  ! could not open rsa_priv.txt for writing\n");
              rsa.padding = 1;
            }
            else {
              rsa.padding = mbedtls_mpi_write_file("N = ",(mbedtls_mpi *)&rsa.len,0x10,(FILE *)pers)
              ;
              if (rsa.padding == 0) {
                rsa.padding = mbedtls_mpi_write_file
                                        ("E = ",(mbedtls_mpi *)&rsa.N.p,0x10,(FILE *)pers);
                if (rsa.padding == 0) {
                  rsa.padding = mbedtls_mpi_write_file
                                          ("D = ",(mbedtls_mpi *)&rsa.E.p,0x10,(FILE *)pers);
                  if (rsa.padding == 0) {
                    rsa.padding = mbedtls_mpi_write_file
                                            ("P = ",(mbedtls_mpi *)&rsa.D.p,0x10,(FILE *)pers);
                    if (rsa.padding == 0) {
                      rsa.padding = mbedtls_mpi_write_file
                                              ("Q = ",(mbedtls_mpi *)&rsa.P.p,0x10,(FILE *)pers);
                      if (rsa.padding == 0) {
                        rsa.padding = mbedtls_mpi_write_file
                                                ("DP = ",(mbedtls_mpi *)&rsa.Q.p,0x10,(FILE *)pers);
                        if (rsa.padding == 0) {
                          rsa.padding = mbedtls_mpi_write_file
                                                  ("DQ = ",(mbedtls_mpi *)&rsa.DP.p,0x10,
                                                   (FILE *)pers);
                          if (rsa.padding == 0) {
                            rsa.padding = mbedtls_mpi_write_file
                                                    ("QP = ",(mbedtls_mpi *)&rsa.DQ.p,0x10,
                                                     (FILE *)pers);
                            if (rsa.padding == 0) {
                              printf(" ok\n\n");
                              goto LAB_0010669c;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)(uint)rsa.padding)
              ;
            }
            goto LAB_0010669c;
          }
        }
        printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)(uint)rsa.padding);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_rsa_gen_key returned %d\n\n",(ulong)(uint)rsa.padding);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)(uint)rsa.padding);
  }
LAB_0010669c:
  if (fpriv != (FILE *)0x0) {
    fclose((FILE *)fpriv);
  }
  if (pers != (char *)0x0) {
    fclose((FILE *)pers);
  }
  mbedtls_rsa_free((mbedtls_rsa_context *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&fpub);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return rsa.padding;
}

Assistant:

int main( void )
{
    int ret;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    FILE *fpub  = NULL;
    FILE *fpriv = NULL;
    const char *pers = "rsa_genkey";

    mbedtls_ctr_drbg_init( &ctr_drbg );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the RSA key [ %d-bit ]...", KEY_SIZE );
    fflush( stdout );

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( ( ret = mbedtls_rsa_gen_key( &rsa, mbedtls_ctr_drbg_random, &ctr_drbg, KEY_SIZE,
                             EXPONENT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the public  key in rsa_pub.txt...." );
    fflush( stdout );

    if( ( fpub = fopen( "rsa_pub.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_pub.txt for writing\n\n" );
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = ", &rsa.N, 16, fpub ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = ", &rsa.E, 16, fpub ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the private key in rsa_priv.txt..." );
    fflush( stdout );

    if( ( fpriv = fopen( "rsa_priv.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_priv.txt for writing\n" );
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = " , &rsa.N , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = " , &rsa.E , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "D = " , &rsa.D , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "P = " , &rsa.P , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "Q = " , &rsa.Q , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DP = ", &rsa.DP, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DQ = ", &rsa.DQ, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "QP = ", &rsa.QP, 16, fpriv ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }
/*
    mbedtls_printf( " ok\n  . Generating the certificate..." );

    x509write_init_raw( &cert );
    x509write_add_pubkey( &cert, &rsa );
    x509write_add_subject( &cert, "CN='localhost'" );
    x509write_add_validity( &cert, "2007-09-06 17:00:32",
                                   "2010-09-06 17:00:32" );
    x509write_create_selfsign( &cert, &rsa );
    x509write_crtfile( &cert, "cert.der", X509_OUTPUT_DER );
    x509write_crtfile( &cert, "cert.pem", X509_OUTPUT_PEM );
    x509write_free_raw( &cert );
*/
    mbedtls_printf( " ok\n\n" );

exit:

    if( fpub  != NULL )
        fclose( fpub );

    if( fpriv != NULL )
        fclose( fpriv );

    mbedtls_rsa_free( &rsa );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}